

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O0

optional<unsigned_long_long> __thiscall QMetaEnum::value64(QMetaEnum *this,int index)

{
  qint32 qVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar2;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  optional<unsigned_long_long> oVar3;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  _Storage<unsigned_long_long,_true> local_18;
  undefined1 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*in_RDI == 0) {
    std::optional<unsigned_long_long>::optional((optional<unsigned_long_long> *)&local_18);
    uVar2 = extraout_RDX;
  }
  else {
    if (-1 < in_ESI) {
      qVar1 = Data::keyCount((Data *)(in_RDI + 1));
      if (in_ESI < qVar1) {
        value_helper<>((QMetaEnum *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffac);
        std::optional<unsigned_long_long>::optional<unsigned_long_long,_true>
                  ((optional<unsigned_long_long> *)
                   CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                   (unsigned_long_long *)
                   CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        uVar2 = extraout_RDX_01;
        goto LAB_003648a0;
      }
    }
    std::optional<unsigned_long_long>::optional((optional<unsigned_long_long> *)&local_18);
    uVar2 = extraout_RDX_00;
  }
LAB_003648a0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    oVar3.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long_long>._9_7_ = (undefined7)((ulong)uVar2 >> 8);
    oVar3.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long_long>._M_engaged = (bool)local_10;
    oVar3.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long_long>._M_payload._M_value = local_18._M_value;
    return (optional<unsigned_long_long>)
           oVar3.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long_long>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<quint64> QMetaEnum::value64(int index) const
{
    if (!mobj)
        return std::nullopt;
    if (index < 0 || index >= int(data.keyCount()))
        return std::nullopt;

    return value_helper(index);
}